

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_72_17_20e643c5 f;
  SquareMatrix<float> local_a0;
  int *local_90 [2];
  long local_80;
  anon_class_72_17_20e643c5 local_78;
  
  (*(this->super_QObject<float>)._vptr_QObject[5])(local_90,this);
  *(ulong *)local_90[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_90[0] >> 0x20),
                offset + (int)*(undefined8 *)local_90[0]);
  (*(this->super_QObject<float>)._vptr_QObject[7])(&local_a0,this);
  lambda_QGate2<float>
            (&local_78,op,&local_a0,
             (vector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start);
  if ((_Head_base<0UL,_float_*,_false>)
      local_a0.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_a0.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  local_a0.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  apply4<qclab::qgates::lambda_QGate2<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_90[0],local_90[0][1],&local_78);
  if (local_90[0] != (int *)0x0) {
    operator_delete(local_90[0],local_80 - (long)local_90[0]);
  }
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }